

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketServer.cpp
# Opt level: O0

void __thiscall
FIX::ServerWrapper::onEvent(ServerWrapper *this,SocketMonitor *monitor,socket_handle socket)

{
  Strategy *pSVar1;
  SocketServer *pSVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  sockaddr *__addr;
  _Self local_30;
  _Self local_28;
  uint local_1c;
  SocketMonitor *pSStack_18;
  socket_handle socket_local;
  SocketMonitor *monitor_local;
  ServerWrapper *this_local;
  
  local_1c = socket;
  pSStack_18 = monitor;
  monitor_local = (SocketMonitor *)this;
  local_28._M_node =
       (_Base_ptr)
       std::set<int,_std::less<int>,_std::allocator<int>_>::find
                 (&this->m_sockets,(key_type *)&local_1c);
  local_30._M_node =
       (_Base_ptr)std::set<int,_std::less<int>,_std::allocator<int>_>::end(&this->m_sockets);
  bVar3 = std::operator!=(&local_28,&local_30);
  uVar5 = local_1c;
  if (bVar3) {
    pSVar1 = this->m_strategy;
    pSVar2 = this->m_server;
    uVar4 = SocketServer::accept(this->m_server,local_1c,__addr,(socklen_t *)(ulong)local_1c);
    (*pSVar1->_vptr_Strategy[2])(pSVar1,pSVar2,(ulong)uVar5,(ulong)uVar4);
  }
  else {
    uVar5 = (*this->m_strategy->_vptr_Strategy[4])(this->m_strategy,this->m_server,(ulong)local_1c);
    if ((uVar5 & 1) == 0) {
      (*(this->super_Strategy)._vptr_Strategy[5])(this,pSStack_18,(ulong)local_1c);
    }
  }
  return;
}

Assistant:

void onEvent(SocketMonitor &monitor, socket_handle socket) {
    if (m_sockets.find(socket) != m_sockets.end()) {
      m_strategy.onConnect(m_server, socket, m_server.accept(socket));
    } else {
      if (!m_strategy.onData(m_server, socket)) {
        onError(monitor, socket);
      }
    }
  }